

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void build_tree(deflate_state *s,tree_desc *desc)

{
  short *psVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ct_data *tree;
  ct_data *pcVar5;
  static_tree_desc *psVar6;
  ct_data *pcVar7;
  intf *piVar8;
  bool bVar9;
  ushort uVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  intf iVar23;
  ush *puVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  ush next_code [16];
  ushort auStack_58 [20];
  
  tree = desc->dyn_tree;
  pcVar5 = desc->stat_desc->static_tree;
  uVar16 = (ulong)desc->stat_desc->elems;
  s->heap_len = 0;
  s->heap_max = 0x23d;
  uVar26 = 0xffffffff;
  if (0 < (long)uVar16) {
    uVar12 = 0;
    do {
      if (tree[uVar12].fc.freq == 0) {
        tree[uVar12].dl.dad = 0;
      }
      else {
        iVar25 = s->heap_len;
        s->heap_len = iVar25 + 1;
        s->heap[(long)iVar25 + 1] = (int)uVar12;
        s->depth[uVar12] = '\0';
        uVar26 = uVar12 & 0xffffffff;
      }
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
  }
  iVar25 = (int)uVar26;
  uVar21 = s->heap_len;
  while ((int)uVar21 < 2) {
    iVar11 = (int)uVar26;
    uVar14 = iVar11 + 1;
    if (iVar11 < 2) {
      uVar26 = (ulong)uVar14;
    }
    iVar25 = (int)uVar26;
    if (1 < iVar11) {
      uVar14 = 0;
    }
    s->heap_len = uVar21 + 1;
    s->heap[(long)(int)uVar21 + 1] = uVar14;
    tree[(int)uVar14].fc.freq = 1;
    s->depth[(int)uVar14] = '\0';
    s->opt_len = s->opt_len - 1;
    if (pcVar5 != (ct_data *)0x0) {
      s->static_len = s->static_len - (ulong)pcVar5[(int)uVar14].dl.dad;
    }
    uVar21 = s->heap_len;
  }
  desc->max_code = iVar25;
  if (1 < uVar21) {
    uVar21 = uVar21 >> 1;
    do {
      pqdownheap(s,tree,uVar21);
      bVar9 = 1 < (int)uVar21;
      uVar21 = uVar21 - 1;
    } while (bVar9);
  }
  do {
    iVar11 = s->heap[1];
    iVar3 = s->heap_len;
    s->heap_len = iVar3 + -1;
    s->heap[1] = s->heap[iVar3];
    pqdownheap(s,tree,1);
    iVar3 = s->heap[1];
    iVar4 = s->heap_max;
    s->heap_max = iVar4 + -1;
    s->heap[(long)iVar4 + -1] = iVar11;
    iVar4 = s->heap_max;
    s->heap_max = iVar4 + -1;
    s->heap[(long)iVar4 + -1] = iVar3;
    tree[uVar16].fc.freq = tree[iVar3].fc.freq + tree[iVar11].fc.freq;
    bVar13 = s->depth[iVar3];
    if (s->depth[iVar3] < s->depth[iVar11]) {
      bVar13 = s->depth[iVar11];
    }
    s->depth[uVar16] = bVar13 + 1;
    tree[iVar3].dl.dad = (ush)uVar16;
    tree[iVar11].dl.dad = (ush)uVar16;
    s->heap[1] = (int)uVar16;
    pqdownheap(s,tree,1);
    uVar16 = uVar16 + 1;
  } while (1 < s->heap_len);
  iVar11 = s->heap[1];
  iVar3 = s->heap_max;
  s->heap_max = iVar3 + -1;
  s->heap[(long)iVar3 + -1] = iVar11;
  pcVar5 = desc->dyn_tree;
  iVar11 = desc->max_code;
  psVar6 = desc->stat_desc;
  pcVar7 = psVar6->static_tree;
  piVar8 = psVar6->extra_bits;
  iVar3 = psVar6->extra_base;
  iVar4 = psVar6->max_length;
  lVar15 = (long)iVar4;
  s->bl_count[8] = 0;
  s->bl_count[9] = 0;
  s->bl_count[10] = 0;
  s->bl_count[0xb] = 0;
  s->bl_count[0xc] = 0;
  s->bl_count[0xd] = 0;
  s->bl_count[0xe] = 0;
  s->bl_count[0xf] = 0;
  s->bl_count[0] = 0;
  s->bl_count[1] = 0;
  s->bl_count[2] = 0;
  s->bl_count[3] = 0;
  s->bl_count[4] = 0;
  s->bl_count[5] = 0;
  s->bl_count[6] = 0;
  s->bl_count[7] = 0;
  pcVar5[s->heap[s->heap_max]].dl.dad = 0;
  iVar17 = s->heap_max;
  if ((long)iVar17 < 0x23c) {
    iVar19 = 0;
    lVar27 = (long)iVar17;
    do {
      iVar17 = s->heap[lVar27 + 1];
      uVar10 = pcVar5[pcVar5[iVar17].dl.dad].dl.dad;
      iVar20 = iVar4;
      if ((int)(uint)uVar10 < iVar4) {
        iVar20 = uVar10 + 1;
      }
      pcVar5[iVar17].dl.dad = (ush)iVar20;
      if (iVar17 <= iVar11) {
        s->bl_count[iVar20] = s->bl_count[iVar20] + 1;
        iVar23 = 0;
        if (iVar3 <= iVar17) {
          iVar23 = piVar8[iVar17 - iVar3];
        }
        uVar2 = pcVar5[iVar17].fc.freq;
        s->opt_len = s->opt_len + (ulong)(uint)(iVar20 + iVar23) * (ulong)uVar2;
        if (pcVar7 != (ct_data *)0x0) {
          s->static_len =
               s->static_len + (ulong)(iVar23 + (uint)pcVar7[iVar17].dl.dad) * (ulong)uVar2;
        }
      }
      iVar19 = iVar19 + (uint)(iVar4 <= (int)(uint)uVar10);
      iVar17 = (int)lVar27;
      lVar27 = lVar27 + 1;
    } while (iVar17 != 0x23b);
    iVar17 = 0x23d;
  }
  else {
    iVar17 = iVar17 + 1;
    iVar19 = 0;
  }
  if (iVar19 != 0) {
    lVar22 = (lVar15 << 0x20) + 0x100000000;
    puVar24 = s->bl_count + lVar15;
    lVar27 = lVar22;
    do {
      do {
        lVar27 = lVar27 + -0x100000000;
        psVar1 = (short *)(puVar24 + -1);
        puVar24 = puVar24 + -1;
      } while (*psVar1 == 0);
      *puVar24 = *psVar1 - 1;
      psVar1 = (short *)((long)s->bl_count + (lVar27 >> 0x1f));
      *psVar1 = *psVar1 + 2;
      s->bl_count[lVar15] = s->bl_count[lVar15] - 1;
      bVar9 = 2 < iVar19;
      puVar24 = s->bl_count + lVar15;
      lVar27 = lVar22;
      iVar19 = iVar19 + -2;
    } while (bVar9);
    if (iVar4 != 0) {
      do {
        uVar21 = (uint)s->bl_count[lVar15];
        if (s->bl_count[lVar15] != 0) {
          do {
            puVar24 = (ush *)(s->heap + (long)iVar17 + -1);
            do {
              iVar3 = *(int *)puVar24;
              iVar17 = iVar17 + -1;
              puVar24 = puVar24 + -2;
            } while (iVar11 < iVar3);
            lVar27 = lVar15 - (ulong)pcVar5[iVar3].dl.dad;
            if (lVar27 != 0) {
              s->opt_len = s->opt_len + lVar27 * (ulong)pcVar5[iVar3].fc.freq;
              pcVar5[iVar3].dl.dad = (ush)lVar15;
            }
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
  }
  lVar15 = 0;
  uVar10 = 0;
  do {
    uVar10 = (s->bl_count[lVar15] + uVar10) * 2;
    auStack_58[lVar15 + 1] = uVar10;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xf);
  if (-1 < iVar25) {
    uVar26 = 0;
    do {
      if (tree[uVar26].dl.dad != 0) {
        uVar21 = (uint)tree[uVar26].dl.dad;
        uVar14 = (uint)auStack_58[uVar21];
        auStack_58[uVar21] = auStack_58[uVar21] + 1;
        iVar11 = uVar21 + 1;
        uVar21 = 0;
        do {
          uVar18 = uVar14 & 1 | uVar21;
          uVar14 = uVar14 >> 1;
          uVar21 = uVar18 * 2;
          iVar11 = iVar11 + -1;
        } while (1 < iVar11);
        tree[uVar26].fc.freq = (ush)uVar18;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != iVar25 + 1);
  }
  return;
}

Assistant:

local void build_tree(deflate_state *s, tree_desc *desc) {
    ct_data *tree         = desc->dyn_tree;
    const ct_data *stree  = desc->stat_desc->static_tree;
    int elems             = desc->stat_desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node;          /* new node being created */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n + 1].
     * heap[0] is not used.
     */
    s->heap_len = 0, s->heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            s->heap[++(s->heap_len)] = max_code = n;
            s->depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (s->heap_len < 2) {
        node = s->heap[++(s->heap_len)] = (max_code < 2 ? ++max_code : 0);
        tree[node].Freq = 1;
        s->depth[node] = 0;
        s->opt_len--; if (stree) s->static_len -= stree[node].Len;
        /* node is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2 + 1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = s->heap_len/2; n >= 1; n--) pqdownheap(s, tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    node = elems;              /* next internal node of the tree */
    do {
        pqremove(s, tree, n);  /* n = node of least frequency */
        m = s->heap[SMALLEST]; /* m = node of next least frequency */

        s->heap[--(s->heap_max)] = n; /* keep the nodes sorted by frequency */
        s->heap[--(s->heap_max)] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = tree[n].Freq + tree[m].Freq;
        s->depth[node] = (uch)((s->depth[n] >= s->depth[m] ?
                                s->depth[n] : s->depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (ush)node;
#ifdef DUMP_BL_TREE
        if (tree == s->bl_tree) {
            fprintf(stderr,"\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        s->heap[SMALLEST] = node++;
        pqdownheap(s, tree, SMALLEST);

    } while (s->heap_len >= 2);

    s->heap[--(s->heap_max)] = s->heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen(s, (tree_desc *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes ((ct_data *)tree, max_code, s->bl_count);
}